

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O0

string * __thiscall
Corrade::Utility::String::Implementation::stripSuffix
          (string *__return_storage_ptr__,Implementation *this,string *string,
          ArrayView<const_char> suffix)

{
  ArrayView<const_char> suffix_00;
  bool bVar1;
  char *data;
  size_t sVar2;
  ostream *output;
  long lVar3;
  Flags local_71;
  Error local_70;
  string *local_48;
  char *local_40;
  ArrayView<const_char> local_38;
  Implementation *local_28;
  string *string_local;
  ArrayView<const_char> suffix_local;
  
  suffix_local._data = suffix._data;
  local_28 = this;
  string_local = string;
  suffix_local._size = (size_t)__return_storage_ptr__;
  data = (char *)std::__cxx11::string::data();
  sVar2 = std::__cxx11::string::size();
  Containers::ArrayView<const_char>::ArrayView(&local_38,data,sVar2);
  local_48 = string_local;
  local_40 = suffix_local._data;
  suffix_00._size = (size_t)suffix_local._data;
  suffix_00._data = (char *)string_local;
  bVar1 = endsWith(local_38,suffix_00);
  if (!bVar1) {
    output = Error::defaultOutput();
    Containers::EnumSet<Corrade::Utility::Debug::Flag,_(unsigned_char)'\xff'>::EnumSet(&local_71);
    Error::Error(&local_70,output,local_71);
    Debug::operator<<(&local_70.super_Debug,
                      "Utility::String::stripSuffix(): string doesn\'t end with given suffix");
    Error::~Error(&local_70);
    abort();
  }
  lVar3 = std::__cxx11::string::size();
  sVar2 = Containers::ArrayView<const_char>::size((ArrayView<const_char> *)&string_local);
  std::__cxx11::string::erase((ulong)this,lVar3 - sVar2);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)this);
  return __return_storage_ptr__;
}

Assistant:

std::string stripSuffix(std::string string, const Containers::ArrayView<const char> suffix) {
    CORRADE_ASSERT(endsWith({string.data(), string.size()}, suffix),
        "Utility::String::stripSuffix(): string doesn't end with given suffix", {});
    string.erase(string.size() - suffix.size());
    return string;
}